

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev1.c
# Opt level: O3

LispPTR N_OP_getbitsnfd(int base_addr,int word_offset,int beta)

{
  return (uint)(*(ushort *)((ulong)(Lisp_world + (uint)(base_addr + word_offset)) ^ 2) >>
               (((byte)(beta & 0xfU) ^ 0xf) - (char)((uint)beta >> 4) & 0x1f)) &
         mask_array[beta & 0xfU] | 0xe0000;
}

Assistant:

LispPTR N_OP_getbitsnfd(int base_addr, int word_offset, int beta) {
  DLword *pword;
  short first;
  short size;

  pword = NativeAligned2FromLAddr(base_addr + word_offset);
  size = 0xF & beta;
  first = beta >> 4;

#ifdef CHECK
  if (base_addr > POINTERMASK) { error("getbits: base out of range"); }
  if (first + size > 15) { error("getbits beta too big"); }
#endif

  return (S_POSITIVE | ((GETWORD(pword) >> (16 - (first + size + 1))) & mask_array[size]));
}